

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_diff.c
# Opt level: O3

int byte_diff(char *s,uint n,char *t)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  
  if (n == 0) {
    return 0;
  }
  lVar3 = 0;
  while( true ) {
    bVar4 = s[lVar3];
    bVar1 = t[lVar3];
    if (bVar4 != bVar1) break;
    iVar2 = (int)lVar3;
    if (n - 1 == iVar2) {
      return 0;
    }
    bVar4 = s[lVar3 + 1];
    bVar1 = t[lVar3 + 1];
    if (bVar4 != bVar1) break;
    if (n - 2 == iVar2) {
      return 0;
    }
    bVar4 = s[lVar3 + 2];
    bVar1 = t[lVar3 + 2];
    if (bVar4 != bVar1) break;
    if (n - 3 == iVar2) {
      return 0;
    }
    bVar4 = s[lVar3 + 3];
    bVar1 = t[lVar3 + 3];
    if (bVar4 != bVar1) break;
    lVar3 = lVar3 + 4;
    if (n == (uint)lVar3) {
      return 0;
    }
  }
  return (uint)bVar4 - (uint)bVar1;
}

Assistant:

int byte_diff(s,n,t)
register char *s;
register unsigned int n;
register char *t;
{
  for (;;) {
    if (!n) return 0; if (*s != *t) break; ++s; ++t; --n;
    if (!n) return 0; if (*s != *t) break; ++s; ++t; --n;
    if (!n) return 0; if (*s != *t) break; ++s; ++t; --n;
    if (!n) return 0; if (*s != *t) break; ++s; ++t; --n;
  }
  return ((int)(unsigned int)(unsigned char) *s)
       - ((int)(unsigned int)(unsigned char) *t);
}